

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

uint16_t __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<unsigned_short>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = ReadAttribute<unsigned_int>(this,name);
    return (uint16_t)uVar2;
  }
  reader = this->m_reader;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_52);
  ThrowAttibuteError(reader,&local_30,&local_50);
}

Assistant:

uint16_t OgreXmlSerializer::ReadAttribute<uint16_t>(const char *name) const
{
    if (HasAttribute(name))
    {
        return static_cast<uint16_t>(ReadAttribute<uint32_t>(name));
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
    }
    return 0;
}